

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O1

void pnga_bin_index(Integer g_bin,Integer g_cnt,Integer g_off,Integer *values,Integer *subs,
                   Integer n,Integer sortit)

{
  int *piVar1;
  uint uVar2;
  size_t sVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  uint uVar8;
  ulong icode;
  long lVar9;
  void *pvVar10;
  int len;
  int left;
  int right;
  int root;
  Integer nbin;
  int lenmes;
  int up;
  Integer type;
  Integer ndim;
  long local_c8;
  uint local_bc;
  void *local_b8;
  long local_b0;
  size_t local_a8;
  int local_9c;
  void *local_98;
  long local_90;
  Integer local_88;
  Integer *local_80;
  Integer local_78;
  Integer *local_70;
  Integer local_68;
  long local_60;
  Integer local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_88 = g_bin;
  local_80 = values;
  local_78 = g_off;
  local_58 = g_cnt;
  pnga_inquire(g_bin,&local_40,&local_38,(Integer *)&local_a8);
  if (local_38 != 1) {
    pnga_error("ga_bin_index: 1-dim array required",local_38);
  }
  if ((0xf < local_40 - 0x3e9U) || ((0x8003UL >> (local_40 - 0x3e9U & 0x3f) & 1) == 0)) {
    pnga_error("ga_bin_index: not integer type",local_40);
  }
  sVar3 = local_a8;
  local_b8 = calloc(local_a8,4);
  if (local_b8 == (void *)0x0) {
    pnga_error("ga_binning:calloc failed",sVar3);
  }
  sVar3 = local_a8;
  local_98 = malloc(local_a8 * 4);
  if (local_98 == (void *)0x0) {
    pnga_error("ga_binning:malloc failed",sVar3);
  }
  if (0 < n) {
    lVar9 = 0;
    do {
      lVar5 = subs[lVar9];
      uVar8 = (uint)lVar5;
      if (((int)uVar8 < 1) || ((long)local_a8 < (long)(ulong)(uVar8 & 0x7fffffff))) {
        pnga_error("wrong bin",(long)(int)uVar8);
      }
      piVar1 = (int *)((long)local_b8 + ((lVar5 << 0x20) + -0x100000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar9 = lVar9 + 1;
    } while (n != lVar9);
  }
  local_70 = subs;
  local_68 = n;
  if (0 < (long)local_a8) {
    local_48 = 0;
    local_60 = 0;
    pvVar7 = local_98;
    pvVar10 = local_b8;
    do {
      uVar8 = (int)local_a8 - (int)local_48;
      if (local_48 + 2000 < (long)local_a8) {
        uVar8 = 2000;
      }
      icode = (ulong)uVar8;
      local_50 = local_48;
      local_48 = local_48 + 2000;
      iVar4 = armci_msg_me();
      if (local_b8 == (void *)0x0) {
        pnga_error("sgai_bin_offset: NULL pointer",(long)(int)uVar8);
      }
      if (2000 < (int)uVar8) {
        pnga_error("sgai_bin_offset: >NWORK",icode);
      }
      len = uVar8 * 4;
      armci_msg_bintree(0x14d,(int *)&local_b0,(int *)&local_90,(int *)&local_c8,(int *)&local_bc);
      if (-1 < (int)(uint)local_c8) {
        armci_msg_rcv(0x7d64,workL,len,&local_9c,(uint)local_c8);
      }
      if (-1 < (int)local_bc) {
        armci_msg_rcv(0x7d64,workR,len,&local_9c,local_bc);
      }
      if ((int)(local_bc | (uint)local_c8) < 0) {
        if ((int)(uint)local_c8 < 0) {
          if (0 < (int)uVar8) {
            memcpy(workL,(void *)(local_60 * 8000 + (long)local_b8),icode << 2);
          }
        }
        else if (0 < (int)uVar8) {
          uVar6 = 0;
          do {
            workL[uVar6] = workL[uVar6] + *(int *)((long)pvVar10 + uVar6 * 4);
            uVar6 = uVar6 + 1;
          } while (icode != uVar6);
        }
      }
      else if (0 < (int)uVar8) {
        uVar6 = 0;
        do {
          workL[uVar6] = workL[uVar6] + *(int *)((long)pvVar10 + uVar6 * 4) + workR[uVar6];
          uVar6 = uVar6 + 1;
        } while (icode != uVar6);
      }
      if ((int)local_90 != -1 && iVar4 != (int)local_b0) {
        armci_msg_snd(0x7d64,workL,len,(int)local_90);
      }
      if ((int)local_90 != -1 && iVar4 != (int)local_b0) {
        armci_msg_rcv(0x7d64,workL,len,&local_9c,(int)local_90);
      }
      if (0 < (int)uVar8) {
        uVar6 = 0;
        do {
          *(int *)((long)pvVar7 + uVar6 * 4) = workL[uVar6] - *(int *)((long)pvVar10 + uVar6 * 4);
          uVar6 = uVar6 + 1;
        } while (icode != uVar6);
      }
      if (-1 < (int)local_bc) {
        armci_msg_snd(0x7d64,(void *)((long)local_98 + local_50 * 4),len,local_bc);
      }
      if (-1 < (int)(uint)local_c8) {
        if (0 < (int)uVar8) {
          uVar6 = 0;
          do {
            workR[uVar6] = *(int *)((long)pvVar7 + uVar6 * 4) - workR[uVar6];
            uVar6 = uVar6 + 1;
          } while (icode != uVar6);
        }
        armci_msg_snd(0x7d64,workR,len,(uint)local_c8);
      }
      local_60 = local_60 + 1;
      pvVar10 = (void *)((long)pvVar10 + 8000);
      pvVar7 = (void *)((long)pvVar7 + 8000);
    } while (local_48 < (long)local_a8);
  }
  uVar8 = 0;
  do {
    lVar9 = (long)(int)uVar8;
    if (local_68 <= lVar9) {
LAB_00145634:
      free(local_98);
      free(local_b8);
      if (sortit == 0) {
        pnga_sync();
      }
      else {
        pnga_bin_sorter(local_88,local_58,local_78);
      }
      return;
    }
    local_c8 = local_70[lVar9];
    uVar2 = *(uint *)((long)local_b8 + local_c8 * 4 + -4);
    pnga_get(local_78,&local_c8,&local_c8,&local_b0,&local_c8);
    lVar5 = (long)*(int *)((long)local_98 + local_c8 * 4 + -4);
    local_90 = lVar5 + local_b0;
    local_b0 = lVar5 + local_b0 + 1;
    local_90 = local_90 + (int)uVar2;
    if ((long)local_a8 < local_b0) {
      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
             (ulong)uVar8,(ulong)uVar2,local_b0,local_90,(long)local_80 + lVar9,local_a8);
      goto LAB_00145634;
    }
    pnga_put(local_88,&local_b0,&local_90,local_80 + lVar9,&local_c8);
    uVar8 = uVar8 + uVar2;
  } while( true );
}

Assistant:

void pnga_bin_index(Integer g_bin, Integer g_cnt, Integer g_off, 
                   Integer *values, Integer *subs, Integer n, Integer sortit)
{
int i, my_nbin=0;
int *all_bin_contrib, *offset;
Integer type, ndim, nbin;

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    all_bin_contrib = (int*)calloc(nbin,sizeof(int));
    if(!all_bin_contrib)pnga_error("ga_binning:calloc failed",nbin);
    offset = (int*)malloc(nbin*sizeof(int));
    if(!offset)pnga_error("ga_binning:malloc failed",nbin);

    /* count how many elements go to each bin */
    for(i=0; i< n; i++){
       int selected = subs[i];
       if(selected <1 || selected> nbin) pnga_error("wrong bin",selected);

       if(all_bin_contrib[selected-1] ==0) my_nbin++; /* new bin found */
       all_bin_contrib[selected-1]++;
    }

    /* process bins in chunks to match available buffer space */
    for(i=0; i<nbin; i+=NWORK){
        int cnbin = ((i+NWORK)<nbin) ? NWORK: nbin -i;
        sgai_bin_offset(SCOPE_ALL, all_bin_contrib+i, cnbin, offset+i);
    }

    for(i=0; i< n; ){
       Integer lo, hi;
       Integer selected = subs[i];
       int elems = all_bin_contrib[selected-1];

       pnga_get(g_off,&selected,&selected, &lo, &selected);
       lo += offset[selected-1]+1;
       hi = lo + elems -1;
/*
       printf("%d: elems=%d lo=%d sel=%d off=%d contrib=%d nbin=%d\n",pnga_nodeid(), elems, lo, selected,offset[selected-1],all_bin_contrib[0],nbin);
*/
       if(lo > nbin) {
	      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
                i,elems,(long)lo,(long)hi,(long)values+i,(long)nbin);
         break;   
       }else{
          pnga_put(g_bin, &lo, &hi, values+i, &selected); 
       }
       i+=elems;
    }
    
    free(offset);
    free(all_bin_contrib);

    if(sortit)pnga_bin_sorter(g_bin, g_cnt, g_off);
    else pnga_sync();
}